

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
cppqc::detail::ListOfStatelessGenerator<int>::unGen
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          ListOfStatelessGenerator<int> *this,RngEngine *rng,size_t size)

{
  _Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
  _Var1;
  result_type_conflict __n;
  bool bVar2;
  uniform_int_distribution<unsigned_long> dist;
  int local_44;
  uniform_int_distribution<unsigned_long> local_40;
  
  local_40._M_param._M_a = 0;
  local_40._M_param._M_b = size;
  __n = std::uniform_int_distribution<unsigned_long>::operator()(&local_40,rng);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  while (bVar2 = __n != 0, __n = __n - 1, bVar2) {
    _Var1.super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>._M_head_impl =
         (this->m_gen).m_gen._M_t.
         super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<int>,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
         .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>;
    local_44 = (**(code **)(*(long *)_Var1.
                                     super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>
                                     ._M_head_impl + 0x10))
                         (_Var1.
                          super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>.
                          _M_head_impl,rng,size);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> unGen(RngEngine& rng, std::size_t size) const {
    std::uniform_int_distribution<std::size_t> dist{0, size};
    std::size_t n = dist(rng);
    std::vector<T> ret;
    ret.reserve(n);
    while (n-- > 0)
      ret.push_back(m_gen.unGen(rng, size));
    return ret;
  }